

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

int32_t icu_63::MessagePattern::validateArgumentName(UnicodeString *name)

{
  short sVar1;
  UBool UVar2;
  int32_t iVar3;
  char16_t *s;
  
  s = UnicodeString::getBuffer(name);
  sVar1 = (name->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (name->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  UVar2 = PatternProps::isIdentifier(s,iVar3);
  if (UVar2 != '\0') {
    sVar1 = (name->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (name->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    iVar3 = parseArgNumber(name,0,iVar3);
    return iVar3;
  }
  return -2;
}

Assistant:

int32_t
MessagePattern::validateArgumentName(const UnicodeString &name) {
    if(!PatternProps::isIdentifier(name.getBuffer(), name.length())) {
        return UMSGPAT_ARG_NAME_NOT_VALID;
    }
    return parseArgNumber(name, 0, name.length());
}